

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O2

void __thiscall
Fl_Xlib_Graphics_Driver::copy_offscreen_with_alpha
          (Fl_Xlib_Graphics_Driver *this,int x,int y,int w,int h,Fl_Offscreen pixmap,int srcx,
          int srcy)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Fl_Region p_Var4;
  XRenderPictureAttributes srcattr;
  
  srcattr.poly_edge = 0;
  srcattr.poly_mode = 0;
  srcattr.dither = 0;
  srcattr.clip_mask = 0;
  srcattr.graphics_exposures = 0;
  srcattr.subwindow_mode = 0;
  srcattr.component_alpha = 0;
  srcattr._68_4_ = 0;
  srcattr.alpha_x_origin = 0;
  srcattr.alpha_y_origin = 0;
  srcattr.clip_x_origin = 0;
  srcattr.clip_y_origin = 0;
  srcattr.repeat = 0;
  srcattr._4_4_ = 0;
  srcattr.alpha_map = 0;
  if (copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::srcfmt == '\0') {
    iVar1 = __cxa_guard_acquire(&copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::
                                 srcfmt);
    if (iVar1 != 0) {
      copy_offscreen_with_alpha::srcfmt =
           (XRenderPictFormat *)XRenderFindStandardFormat(fl_display,0);
      __cxa_guard_release(&copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::srcfmt)
      ;
    }
  }
  if (copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::dstfmt == '\0') {
    iVar1 = __cxa_guard_acquire(&copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::
                                 dstfmt);
    if (iVar1 != 0) {
      copy_offscreen_with_alpha::dstfmt =
           (XRenderPictFormat *)XRenderFindStandardFormat(fl_display,1);
      __cxa_guard_release(&copy_offscreen_with_alpha(int,int,int,int,unsigned_long,int,int)::dstfmt)
      ;
    }
  }
  lVar2 = XRenderCreatePicture(fl_display,pixmap,copy_offscreen_with_alpha::srcfmt,0,&srcattr);
  lVar3 = XRenderCreatePicture(fl_display,fl_window,copy_offscreen_with_alpha::dstfmt,0,&srcattr);
  if ((lVar2 == 0) || (lVar3 == 0)) {
    fprintf(_stderr,"Failed to create Render pictures (%lu %lu)\n",lVar2,lVar3);
  }
  else {
    p_Var4 = fl_clip_region();
    if (p_Var4 != (Fl_Region)0x0) {
      XRenderSetPictureClipRegion(fl_display,lVar3,p_Var4);
    }
    XRenderComposite(fl_display,3,lVar2,0,lVar3,srcx,srcy,0,0,x,y,w,h);
    XRenderFreePicture(fl_display,lVar2);
    XRenderFreePicture(fl_display,lVar3);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::copy_offscreen_with_alpha(int x, int y, int w, int h,
						        Fl_Offscreen pixmap, int srcx, int srcy) {
#if HAVE_XRENDER
  XRenderPictureAttributes srcattr;
  memset(&srcattr, 0, sizeof(XRenderPictureAttributes));
  static XRenderPictFormat *srcfmt = XRenderFindStandardFormat(fl_display, PictStandardARGB32);
  static XRenderPictFormat *dstfmt = XRenderFindStandardFormat(fl_display, PictStandardRGB24);

  Picture src = XRenderCreatePicture(fl_display, pixmap, srcfmt, 0, &srcattr);
  Picture dst = XRenderCreatePicture(fl_display, fl_window, dstfmt, 0, &srcattr);

  if (!src || !dst) {
    fprintf(stderr, "Failed to create Render pictures (%lu %lu)\n", src, dst);
    return;
  }

  const Fl_Region clipr = fl_clip_region();
  if (clipr)
    XRenderSetPictureClipRegion(fl_display, dst, clipr);

  XRenderComposite(fl_display, PictOpOver, src, None, dst, srcx, srcy, 0, 0,
  			x, y, w, h);

  XRenderFreePicture(fl_display, src);
  XRenderFreePicture(fl_display, dst);
#endif
}